

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O3

bool __thiscall uttt::IBoard::operator==(IBoard *this,IBoard *other)

{
  short sVar1;
  short sVar2;
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  IBoard vertical;
  IBoard rotated;
  IBoard local_58;
  IBoard local_38;
  
  iVar3 = other->macro;
  if (((this->macro != iVar3) ||
      (auVar5[0] = -((char)(other->micro)._M_elems[0] == (char)(this->micro)._M_elems[0]),
      auVar5[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                   *(char *)((long)(this->micro)._M_elems + 1)),
      auVar5[2] = -((char)(other->micro)._M_elems[1] == (char)(this->micro)._M_elems[1]),
      auVar5[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                   *(char *)((long)(this->micro)._M_elems + 3)),
      auVar5[4] = -((char)(other->micro)._M_elems[2] == (char)(this->micro)._M_elems[2]),
      auVar5[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                   *(char *)((long)(this->micro)._M_elems + 5)),
      auVar5[6] = -((char)(other->micro)._M_elems[3] == (char)(this->micro)._M_elems[3]),
      auVar5[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                   *(char *)((long)(this->micro)._M_elems + 7)),
      auVar5[8] = -((char)(other->micro)._M_elems[4] == (char)(this->micro)._M_elems[4]),
      auVar5[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                   *(char *)((long)(this->micro)._M_elems + 9)),
      auVar5[10] = -((char)(other->micro)._M_elems[5] == (char)(this->micro)._M_elems[5]),
      auVar5[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                     *(char *)((long)(this->micro)._M_elems + 0xb)),
      auVar5[0xc] = -((char)(other->micro)._M_elems[6] == (char)(this->micro)._M_elems[6]),
      auVar5[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                     *(char *)((long)(this->micro)._M_elems + 0xd)),
      auVar5[0xe] = -((char)(other->micro)._M_elems[7] == (char)(this->micro)._M_elems[7]),
      auVar5[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                     *(char *)((long)(this->micro)._M_elems + 0xf)),
      sVar1 = (this->micro)._M_elems[8], sVar2 = (other->micro)._M_elems[8],
      auVar13[0] = -((char)sVar2 == (char)sVar1),
      auVar13[1] = -((char)((ushort)sVar2 >> 8) == (char)((ushort)sVar1 >> 8)), auVar13[2] = 0xff,
      auVar13[3] = 0xff, auVar13[4] = 0xff, auVar13[5] = 0xff, auVar13[6] = 0xff, auVar13[7] = 0xff,
      auVar13[8] = 0xff, auVar13[9] = 0xff, auVar13[10] = 0xff, auVar13[0xb] = 0xff,
      auVar13[0xc] = 0xff, auVar13[0xd] = 0xff, auVar13[0xe] = 0xff, auVar13[0xf] = 0xff,
      auVar13 = auVar13 & auVar5,
      (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff)) ||
     (bVar4 = true, this->next != other->next)) {
    local_38._16_8_ = *(undefined8 *)((this->micro)._M_elems + 6);
    local_38.macro = this->macro;
    local_38.micro._M_elems[0] = (this->micro)._M_elems[0];
    local_38.micro._M_elems[1] = (this->micro)._M_elems[1];
    local_38.micro._M_elems._4_8_ = *(undefined8 *)((this->micro)._M_elems + 2);
    RotateClockWise90(&local_38);
    if (((local_38.macro != iVar3) ||
        (auVar6[0] = -((char)(other->micro)._M_elems[0] == (char)local_38.micro._M_elems[0]),
        auVar6[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                     local_38.micro._M_elems[0]._1_1_),
        auVar6[2] = -((char)(other->micro)._M_elems[1] == (char)local_38.micro._M_elems[1]),
        auVar6[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                     local_38.micro._M_elems[1]._1_1_),
        auVar6[4] = -((char)(other->micro)._M_elems[2] == (char)local_38.micro._M_elems[2]),
        auVar6[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                     local_38.micro._M_elems[2]._1_1_),
        auVar6[6] = -((char)(other->micro)._M_elems[3] == (char)local_38.micro._M_elems[3]),
        auVar6[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                     local_38.micro._M_elems[3]._1_1_),
        auVar6[8] = -((char)(other->micro)._M_elems[4] == (char)local_38.micro._M_elems[4]),
        auVar6[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                     local_38.micro._M_elems[4]._1_1_),
        auVar6[10] = -((char)(other->micro)._M_elems[5] == (char)local_38.micro._M_elems[5]),
        auVar6[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                       local_38.micro._M_elems[5]._1_1_),
        auVar6[0xc] = -((char)(other->micro)._M_elems[6] == (char)local_38.micro._M_elems[6]),
        auVar6[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                       local_38.micro._M_elems[6]._1_1_),
        auVar6[0xe] = -((char)(other->micro)._M_elems[7] == (char)local_38.micro._M_elems[7]),
        auVar6[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                       local_38.micro._M_elems[7]._1_1_), sVar1 = (other->micro)._M_elems[8],
        auVar14[0] = -((char)sVar1 == (char)local_38.micro._M_elems[8]),
        auVar14[1] = -((char)((ushort)sVar1 >> 8) == local_38.micro._M_elems[8]._1_1_),
        auVar14[2] = 0xff, auVar14[3] = 0xff, auVar14[4] = 0xff, auVar14[5] = 0xff,
        auVar14[6] = 0xff, auVar14[7] = 0xff, auVar14[8] = 0xff, auVar14[9] = 0xff,
        auVar14[10] = 0xff, auVar14[0xb] = 0xff, auVar14[0xc] = 0xff, auVar14[0xd] = 0xff,
        auVar14[0xe] = 0xff, auVar14[0xf] = 0xff, auVar14 = auVar14 & auVar6,
        (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff)) ||
       (bVar4 = true, local_38.next != other->next)) {
      RotateClockWise90(&local_38);
      if (((local_38.macro != iVar3) ||
          (auVar7[0] = -((char)(other->micro)._M_elems[0] == (char)local_38.micro._M_elems[0]),
          auVar7[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                       local_38.micro._M_elems[0]._1_1_),
          auVar7[2] = -((char)(other->micro)._M_elems[1] == (char)local_38.micro._M_elems[1]),
          auVar7[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                       local_38.micro._M_elems[1]._1_1_),
          auVar7[4] = -((char)(other->micro)._M_elems[2] == (char)local_38.micro._M_elems[2]),
          auVar7[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                       local_38.micro._M_elems[2]._1_1_),
          auVar7[6] = -((char)(other->micro)._M_elems[3] == (char)local_38.micro._M_elems[3]),
          auVar7[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                       local_38.micro._M_elems[3]._1_1_),
          auVar7[8] = -((char)(other->micro)._M_elems[4] == (char)local_38.micro._M_elems[4]),
          auVar7[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                       local_38.micro._M_elems[4]._1_1_),
          auVar7[10] = -((char)(other->micro)._M_elems[5] == (char)local_38.micro._M_elems[5]),
          auVar7[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                         local_38.micro._M_elems[5]._1_1_),
          auVar7[0xc] = -((char)(other->micro)._M_elems[6] == (char)local_38.micro._M_elems[6]),
          auVar7[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                         local_38.micro._M_elems[6]._1_1_),
          auVar7[0xe] = -((char)(other->micro)._M_elems[7] == (char)local_38.micro._M_elems[7]),
          auVar7[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                         local_38.micro._M_elems[7]._1_1_), sVar1 = (other->micro)._M_elems[8],
          auVar15[0] = -((char)sVar1 == (char)local_38.micro._M_elems[8]),
          auVar15[1] = -((char)((ushort)sVar1 >> 8) == local_38.micro._M_elems[8]._1_1_),
          auVar15[2] = 0xff, auVar15[3] = 0xff, auVar15[4] = 0xff, auVar15[5] = 0xff,
          auVar15[6] = 0xff, auVar15[7] = 0xff, auVar15[8] = 0xff, auVar15[9] = 0xff,
          auVar15[10] = 0xff, auVar15[0xb] = 0xff, auVar15[0xc] = 0xff, auVar15[0xd] = 0xff,
          auVar15[0xe] = 0xff, auVar15[0xf] = 0xff, auVar15 = auVar15 & auVar7,
          (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff)) ||
         (bVar4 = true, local_38.next != other->next)) {
        RotateClockWise90(&local_38);
        if (((local_38.macro != iVar3) ||
            (auVar8[0] = -((char)(other->micro)._M_elems[0] == (char)local_38.micro._M_elems[0]),
            auVar8[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                         local_38.micro._M_elems[0]._1_1_),
            auVar8[2] = -((char)(other->micro)._M_elems[1] == (char)local_38.micro._M_elems[1]),
            auVar8[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                         local_38.micro._M_elems[1]._1_1_),
            auVar8[4] = -((char)(other->micro)._M_elems[2] == (char)local_38.micro._M_elems[2]),
            auVar8[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                         local_38.micro._M_elems[2]._1_1_),
            auVar8[6] = -((char)(other->micro)._M_elems[3] == (char)local_38.micro._M_elems[3]),
            auVar8[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                         local_38.micro._M_elems[3]._1_1_),
            auVar8[8] = -((char)(other->micro)._M_elems[4] == (char)local_38.micro._M_elems[4]),
            auVar8[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                         local_38.micro._M_elems[4]._1_1_),
            auVar8[10] = -((char)(other->micro)._M_elems[5] == (char)local_38.micro._M_elems[5]),
            auVar8[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                           local_38.micro._M_elems[5]._1_1_),
            auVar8[0xc] = -((char)(other->micro)._M_elems[6] == (char)local_38.micro._M_elems[6]),
            auVar8[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                           local_38.micro._M_elems[6]._1_1_),
            auVar8[0xe] = -((char)(other->micro)._M_elems[7] == (char)local_38.micro._M_elems[7]),
            auVar8[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                           local_38.micro._M_elems[7]._1_1_), sVar1 = (other->micro)._M_elems[8],
            auVar16[0] = -((char)sVar1 == (char)local_38.micro._M_elems[8]),
            auVar16[1] = -((char)((ushort)sVar1 >> 8) == local_38.micro._M_elems[8]._1_1_),
            auVar16[2] = 0xff, auVar16[3] = 0xff, auVar16[4] = 0xff, auVar16[5] = 0xff,
            auVar16[6] = 0xff, auVar16[7] = 0xff, auVar16[8] = 0xff, auVar16[9] = 0xff,
            auVar16[10] = 0xff, auVar16[0xb] = 0xff, auVar16[0xc] = 0xff, auVar16[0xd] = 0xff,
            auVar16[0xe] = 0xff, auVar16[0xf] = 0xff, auVar16 = auVar16 & auVar8,
            (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff)) ||
           (bVar4 = true, local_38.next != other->next)) {
          local_58._16_8_ = *(undefined8 *)((this->micro)._M_elems + 6);
          local_58.macro = this->macro;
          local_58.micro._M_elems[0] = (this->micro)._M_elems[0];
          local_58.micro._M_elems[1] = (this->micro)._M_elems[1];
          local_58.micro._M_elems._4_8_ = *(undefined8 *)((this->micro)._M_elems + 2);
          MirrorVertical(&local_58);
          if (((local_58.macro != iVar3) ||
              (auVar9[0] = -((char)(other->micro)._M_elems[0] == (char)local_58.micro._M_elems[0]),
              auVar9[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                           local_58.micro._M_elems[0]._1_1_),
              auVar9[2] = -((char)(other->micro)._M_elems[1] == (char)local_58.micro._M_elems[1]),
              auVar9[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                           local_58.micro._M_elems[1]._1_1_),
              auVar9[4] = -((char)(other->micro)._M_elems[2] == (char)local_58.micro._M_elems[2]),
              auVar9[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                           local_58.micro._M_elems[2]._1_1_),
              auVar9[6] = -((char)(other->micro)._M_elems[3] == (char)local_58.micro._M_elems[3]),
              auVar9[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                           local_58.micro._M_elems[3]._1_1_),
              auVar9[8] = -((char)(other->micro)._M_elems[4] == (char)local_58.micro._M_elems[4]),
              auVar9[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                           local_58.micro._M_elems[4]._1_1_),
              auVar9[10] = -((char)(other->micro)._M_elems[5] == (char)local_58.micro._M_elems[5]),
              auVar9[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                             local_58.micro._M_elems[5]._1_1_),
              auVar9[0xc] = -((char)(other->micro)._M_elems[6] == (char)local_58.micro._M_elems[6]),
              auVar9[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                             local_58.micro._M_elems[6]._1_1_),
              auVar9[0xe] = -((char)(other->micro)._M_elems[7] == (char)local_58.micro._M_elems[7]),
              auVar9[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                             local_58.micro._M_elems[7]._1_1_), sVar1 = (other->micro)._M_elems[8],
              auVar17[0] = -((char)sVar1 == (char)local_58.micro._M_elems[8]),
              auVar17[1] = -((char)((ushort)sVar1 >> 8) == local_58.micro._M_elems[8]._1_1_),
              auVar17[2] = 0xff, auVar17[3] = 0xff, auVar17[4] = 0xff, auVar17[5] = 0xff,
              auVar17[6] = 0xff, auVar17[7] = 0xff, auVar17[8] = 0xff, auVar17[9] = 0xff,
              auVar17[10] = 0xff, auVar17[0xb] = 0xff, auVar17[0xc] = 0xff, auVar17[0xd] = 0xff,
              auVar17[0xe] = 0xff, auVar17[0xf] = 0xff, auVar17 = auVar17 & auVar9,
              (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff)) ||
             (bVar4 = true, local_58.next != other->next)) {
            RotateClockWise90(&local_58);
            if (((local_58.macro != iVar3) ||
                (auVar10[0] = -((char)(other->micro)._M_elems[0] == (char)local_58.micro._M_elems[0]
                               ),
                auVar10[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                              local_58.micro._M_elems[0]._1_1_),
                auVar10[2] = -((char)(other->micro)._M_elems[1] == (char)local_58.micro._M_elems[1])
                , auVar10[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                                local_58.micro._M_elems[1]._1_1_),
                auVar10[4] = -((char)(other->micro)._M_elems[2] == (char)local_58.micro._M_elems[2])
                , auVar10[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                                local_58.micro._M_elems[2]._1_1_),
                auVar10[6] = -((char)(other->micro)._M_elems[3] == (char)local_58.micro._M_elems[3])
                , auVar10[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                                local_58.micro._M_elems[3]._1_1_),
                auVar10[8] = -((char)(other->micro)._M_elems[4] == (char)local_58.micro._M_elems[4])
                , auVar10[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                                local_58.micro._M_elems[4]._1_1_),
                auVar10[10] = -((char)(other->micro)._M_elems[5] == (char)local_58.micro._M_elems[5]
                               ),
                auVar10[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                                local_58.micro._M_elems[5]._1_1_),
                auVar10[0xc] = -((char)(other->micro)._M_elems[6] ==
                                (char)local_58.micro._M_elems[6]),
                auVar10[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                                local_58.micro._M_elems[6]._1_1_),
                auVar10[0xe] = -((char)(other->micro)._M_elems[7] ==
                                (char)local_58.micro._M_elems[7]),
                auVar10[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                                local_58.micro._M_elems[7]._1_1_),
                sVar1 = (other->micro)._M_elems[8],
                auVar18[0] = -((char)sVar1 == (char)local_58.micro._M_elems[8]),
                auVar18[1] = -((char)((ushort)sVar1 >> 8) == local_58.micro._M_elems[8]._1_1_),
                auVar18[2] = 0xff, auVar18[3] = 0xff, auVar18[4] = 0xff, auVar18[5] = 0xff,
                auVar18[6] = 0xff, auVar18[7] = 0xff, auVar18[8] = 0xff, auVar18[9] = 0xff,
                auVar18[10] = 0xff, auVar18[0xb] = 0xff, auVar18[0xc] = 0xff, auVar18[0xd] = 0xff,
                auVar18[0xe] = 0xff, auVar18[0xf] = 0xff, auVar18 = auVar18 & auVar10,
                (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff)) ||
               (bVar4 = true, local_58.next != other->next)) {
              RotateClockWise90(&local_58);
              if (((local_58.macro != iVar3) ||
                  (auVar11[0] = -((char)(other->micro)._M_elems[0] ==
                                 (char)local_58.micro._M_elems[0]),
                  auVar11[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                                local_58.micro._M_elems[0]._1_1_),
                  auVar11[2] = -((char)(other->micro)._M_elems[1] ==
                                (char)local_58.micro._M_elems[1]),
                  auVar11[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                                local_58.micro._M_elems[1]._1_1_),
                  auVar11[4] = -((char)(other->micro)._M_elems[2] ==
                                (char)local_58.micro._M_elems[2]),
                  auVar11[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                                local_58.micro._M_elems[2]._1_1_),
                  auVar11[6] = -((char)(other->micro)._M_elems[3] ==
                                (char)local_58.micro._M_elems[3]),
                  auVar11[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                                local_58.micro._M_elems[3]._1_1_),
                  auVar11[8] = -((char)(other->micro)._M_elems[4] ==
                                (char)local_58.micro._M_elems[4]),
                  auVar11[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                                local_58.micro._M_elems[4]._1_1_),
                  auVar11[10] = -((char)(other->micro)._M_elems[5] ==
                                 (char)local_58.micro._M_elems[5]),
                  auVar11[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                                  local_58.micro._M_elems[5]._1_1_),
                  auVar11[0xc] = -((char)(other->micro)._M_elems[6] ==
                                  (char)local_58.micro._M_elems[6]),
                  auVar11[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                                  local_58.micro._M_elems[6]._1_1_),
                  auVar11[0xe] = -((char)(other->micro)._M_elems[7] ==
                                  (char)local_58.micro._M_elems[7]),
                  auVar11[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                                  local_58.micro._M_elems[7]._1_1_),
                  sVar1 = (other->micro)._M_elems[8],
                  auVar19[0] = -((char)sVar1 == (char)local_58.micro._M_elems[8]),
                  auVar19[1] = -((char)((ushort)sVar1 >> 8) == local_58.micro._M_elems[8]._1_1_),
                  auVar19[2] = 0xff, auVar19[3] = 0xff, auVar19[4] = 0xff, auVar19[5] = 0xff,
                  auVar19[6] = 0xff, auVar19[7] = 0xff, auVar19[8] = 0xff, auVar19[9] = 0xff,
                  auVar19[10] = 0xff, auVar19[0xb] = 0xff, auVar19[0xc] = 0xff, auVar19[0xd] = 0xff,
                  auVar19[0xe] = 0xff, auVar19[0xf] = 0xff, auVar19 = auVar19 & auVar11,
                  (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff)) ||
                 (bVar4 = true, local_58.next != other->next)) {
                RotateClockWise90(&local_58);
                if (((local_58.macro != iVar3) ||
                    (auVar12[0] = -((char)(other->micro)._M_elems[0] ==
                                   (char)local_58.micro._M_elems[0]),
                    auVar12[1] = -(*(char *)((long)(other->micro)._M_elems + 1) ==
                                  local_58.micro._M_elems[0]._1_1_),
                    auVar12[2] = -((char)(other->micro)._M_elems[1] ==
                                  (char)local_58.micro._M_elems[1]),
                    auVar12[3] = -(*(char *)((long)(other->micro)._M_elems + 3) ==
                                  local_58.micro._M_elems[1]._1_1_),
                    auVar12[4] = -((char)(other->micro)._M_elems[2] ==
                                  (char)local_58.micro._M_elems[2]),
                    auVar12[5] = -(*(char *)((long)(other->micro)._M_elems + 5) ==
                                  local_58.micro._M_elems[2]._1_1_),
                    auVar12[6] = -((char)(other->micro)._M_elems[3] ==
                                  (char)local_58.micro._M_elems[3]),
                    auVar12[7] = -(*(char *)((long)(other->micro)._M_elems + 7) ==
                                  local_58.micro._M_elems[3]._1_1_),
                    auVar12[8] = -((char)(other->micro)._M_elems[4] ==
                                  (char)local_58.micro._M_elems[4]),
                    auVar12[9] = -(*(char *)((long)(other->micro)._M_elems + 9) ==
                                  local_58.micro._M_elems[4]._1_1_),
                    auVar12[10] = -((char)(other->micro)._M_elems[5] ==
                                   (char)local_58.micro._M_elems[5]),
                    auVar12[0xb] = -(*(char *)((long)(other->micro)._M_elems + 0xb) ==
                                    local_58.micro._M_elems[5]._1_1_),
                    auVar12[0xc] = -((char)(other->micro)._M_elems[6] ==
                                    (char)local_58.micro._M_elems[6]),
                    auVar12[0xd] = -(*(char *)((long)(other->micro)._M_elems + 0xd) ==
                                    local_58.micro._M_elems[6]._1_1_),
                    auVar12[0xe] = -((char)(other->micro)._M_elems[7] ==
                                    (char)local_58.micro._M_elems[7]),
                    auVar12[0xf] = -(*(char *)((long)(other->micro)._M_elems + 0xf) ==
                                    local_58.micro._M_elems[7]._1_1_),
                    sVar1 = (other->micro)._M_elems[8],
                    auVar20[0] = -((char)sVar1 == (char)local_58.micro._M_elems[8]),
                    auVar20[1] = -((char)((ushort)sVar1 >> 8) == local_58.micro._M_elems[8]._1_1_),
                    auVar20[2] = 0xff, auVar20[3] = 0xff, auVar20[4] = 0xff, auVar20[5] = 0xff,
                    auVar20[6] = 0xff, auVar20[7] = 0xff, auVar20[8] = 0xff, auVar20[9] = 0xff,
                    auVar20[10] = 0xff, auVar20[0xb] = 0xff, auVar20[0xc] = 0xff,
                    auVar20[0xd] = 0xff, auVar20[0xe] = 0xff, auVar20[0xf] = 0xff,
                    auVar20 = auVar20 & auVar12,
                    (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff)) ||
                   (bVar4 = true, local_58.next != other->next)) {
                  bVar4 = false;
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool
IBoard::operator==(const IBoard &other) const
{
    if (macro == other.macro && micro == other.micro && next == other.next)
        return true;
    IBoard rotated(*this);
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;

    IBoard vertical(*this);
    vertical.MirrorVertical();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    return false;
}